

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TransformFeedback::DrawXFB::iterate(DrawXFB *this)

{
  RenderContext *pRVar1;
  ContextInfo *this_00;
  ulong uVar2;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  bool local_4e5;
  byte local_4e4;
  bool local_4e2;
  byte local_4e1;
  bool local_4cb;
  byte local_4ca;
  byte local_4c9;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  MessageBuilder local_1c0;
  uint local_40;
  uint local_3c;
  GLuint j_2;
  GLuint j_1;
  GLuint j;
  uint local_24;
  byte local_1f;
  byte local_1e;
  undefined1 local_1d;
  GLuint i;
  bool test_error;
  bool is_ok;
  ApiType AStack_18;
  bool is_arb_tf_2;
  byte local_11;
  DrawXFB *pDStack_10;
  bool is_at_least_gl_40;
  DrawXFB *this_local;
  
  pDStack_10 = this;
  pRVar1 = deqp::Context::getRenderContext(this->m_context);
  AStack_18.m_bits = (*pRVar1->_vptr_RenderContext[2])();
  i = (GLuint)glu::ApiType::core(4,0);
  local_11 = glu::contextSupports((ContextType)AStack_18.m_bits,(ApiType)i);
  this_00 = deqp::Context::getContextInfo(this->m_context);
  local_1d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_transform_feedback2");
  local_1e = 1;
  local_1f = 0;
  if (((local_11 & 1) != 0) || ((bool)local_1d)) {
    local_24 = 0;
    while( true ) {
      local_4c9 = 0;
      if (local_24 < 2) {
        local_4c9 = local_1e;
      }
      if ((local_4c9 & 1) == 0) break;
      prepare(this,s_capture_modes[local_24]);
      bindVAO(this,this->m_vao_id);
      useProgram(this,this->m_program_id_xfb);
      j_2 = 0;
      while( true ) {
        local_4ca = 0;
        if (j_2 < 3) {
          local_4ca = local_1e;
        }
        if ((local_4ca & 1) == 0) break;
        bindXFB(this,this->m_xfb_id[j_2]);
        bindBOForXFB(this,s_capture_modes[local_24],this->m_bo_id[j_2]);
        uVar2 = (ulong)j_2;
        useColour(this,this->m_program_id_xfb,s_colours[uVar2][0],s_colours[uVar2][1],
                  s_colours[uVar2][2],s_colours[uVar2][3]);
        useGeometrySet(this,this->m_program_id_xfb,false);
        drawForCapture(this,true,true,false,false);
        local_4cb = false;
        if ((local_1e & 1) != 0) {
          local_4cb = inspectXFBState(this,true,true);
        }
        local_1e = local_4cb;
        j_2 = j_2 + 1;
      }
      local_3c = 0;
      while( true ) {
        local_4e1 = 0;
        if (local_3c < 3) {
          local_4e1 = local_1e;
        }
        if ((local_4e1 & 1) == 0) break;
        bindXFB(this,this->m_xfb_id[local_3c]);
        uVar2 = (ulong)local_3c;
        useColour(this,this->m_program_id_xfb,s_colours[uVar2][0],s_colours[uVar2][1],
                  s_colours[uVar2][2],s_colours[uVar2][3]);
        useGeometrySet(this,this->m_program_id_xfb,true);
        drawForCapture(this,false,false,true,true);
        local_4e2 = false;
        if ((local_1e & 1) != 0) {
          local_4e2 = inspectXFBState(this,false,false);
        }
        local_1e = local_4e2;
        local_3c = local_3c + 1;
      }
      useProgram(this,this->m_program_id_draw);
      local_40 = 0;
      while( true ) {
        local_4e4 = 0;
        if (local_40 < 3) {
          local_4e4 = local_1e;
        }
        if ((local_4e4 & 1) == 0) break;
        bindXFB(this,this->m_xfb_id[local_40]);
        bindBOForDraw(this,this->m_program_id_draw,s_capture_modes[local_24],this->m_bo_id[local_40]
                     );
        drawToFramebuffer(this,this->m_xfb_id[local_40]);
        local_4e5 = false;
        if ((local_1e & 1) != 0) {
          uVar2 = (ulong)local_40;
          local_4e5 = checkFramebuffer(this,s_colours[uVar2][0],s_colours[uVar2][1],
                                       s_colours[uVar2][2],s_colours[uVar2][3]);
        }
        local_1e = local_4e5;
        local_40 = local_40 + 1;
      }
      clean(this);
      local_24 = local_24 + 1;
    }
  }
  if ((local_1e & 1) == 0) {
    if ((local_1f & 1) == 0) {
      pTVar3 = deqp::Context::getTestContext(this->m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_4c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [22])"Draw XFB have failed.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      pTVar3 = deqp::Context::getTestContext(this->m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_340,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_340,(char (*) [32])"Draw XFB have approached error.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_340);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    pTVar3 = deqp::Context::getTestContext(this->m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [22])"Draw XFB have passed.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFB::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_2	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback2");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || is_arb_tf_2)
		{
			for (glw::GLuint i = 0; (i < s_capture_modes_count) && is_ok; ++i)
			{
				prepare(s_capture_modes[i]);

				bindVAO(m_vao_id);
				useProgram(m_program_id_xfb);

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					bindBOForXFB(s_capture_modes[i], m_bo_id[j]);
					useColour(m_program_id_xfb, s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
					useGeometrySet(m_program_id_xfb, false);
					drawForCapture(true, true, false, false);

					is_ok = is_ok && inspectXFBState(true, true);
				}

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					useColour(m_program_id_xfb, s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
					useGeometrySet(m_program_id_xfb, true);
					drawForCapture(false, false, true, true);

					is_ok = is_ok && inspectXFBState(false, false);
				}

				useProgram(m_program_id_draw);

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					bindBOForDraw(m_program_id_draw, s_capture_modes[i], m_bo_id[j]);
					drawToFramebuffer(m_xfb_id[j]);

					is_ok =
						is_ok && checkFramebuffer(s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
				}

				clean();
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
		clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}